

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O2

void __thiscall PartsBupOutputter::~PartsBupOutputter(PartsBupOutputter *this)

{
  (this->super_BupOutputter)._vptr_BupOutputter = (_func_int **)&PTR__PartsBupOutputter_0011cca8;
  writeJSON(this);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
  ::~vector(&this->expressions);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            (&(this->tmp).colorData.super__Vector_base<Color,_std::allocator<Color>_>);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            (&(this->withFace).colorData.super__Vector_base<Color,_std::allocator<Color>_>);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            (&(this->base).colorData.super__Vector_base<Color,_std::allocator<Color>_>);
  std::__cxx11::string::~string((string *)&this->withMouthName);
  std::__cxx11::string::~string((string *)&this->withFaceName);
  std::__cxx11::string::~string((string *)&this->baseName);
  std::filesystem::__cxx11::path::~path(&this->partsPath);
  std::filesystem::__cxx11::path::~path(&this->basePath);
  return;
}

Assistant:

~PartsBupOutputter() {
		writeJSON();
	}